

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator_icu.cpp
# Opt level: O2

int __thiscall QCollator::compare(QCollator *this,QStringView s1,QStringView s2)

{
  CollatorType pUVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = s2.m_size;
  if (s1.m_size == 0) {
    iVar2 = -(uint)(uVar3 != 0);
  }
  else {
    if (uVar3 != 0) {
      QCollatorPrivate::ensureInitialized(this->d);
      pUVar1 = this->d->collator;
      if (pUVar1 != (CollatorType)0x0) {
        iVar2 = ucol_strcoll_70(pUVar1,s1.m_data,s1.m_size & 0xffffffff,s2.m_data,uVar3 & 0xffffffff
                               );
        return iVar2;
      }
      iVar2 = QtPrivate::compareStrings(s1,s2,this->d->caseSensitivity);
      return iVar2;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int QCollator::compare(QStringView s1, QStringView s2) const
{
    if (!s1.size())
        return s2.size() ? -1 : 0;
    if (!s2.size())
        return +1;

    d->ensureInitialized();

    if (d->collator) {
        // truncating sizes (QTBUG-105038)
        return ucol_strcoll(d->collator,
                            reinterpret_cast<const UChar *>(s1.data()), s1.size(),
                            reinterpret_cast<const UChar *>(s2.data()), s2.size());
    }

    return QtPrivate::compareStrings(s1, s2, d->caseSensitivity);
}